

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-accept.c
# Opt level: O1

int run_test_tcp_close_accept(void)

{
  int iVar1;
  code *pcVar2;
  ulong uVar3;
  undefined8 *extraout_RDX;
  uint uVar4;
  int iVar5;
  uv_tcp_t *puVar6;
  uv_loop_t *puVar7;
  uv_loop_t *puVar8;
  uv_tcp_t *puVar9;
  code *unaff_R12;
  long lVar10;
  long unaff_R13;
  uv_tcp_t *unaff_R14;
  sockaddr_in *unaff_R15;
  undefined1 auStack_78 [16];
  uv_loop_t *puStack_68;
  uv_loop_t *puStack_60;
  code *pcStack_58;
  long lStack_50;
  uv_tcp_t *puStack_48;
  sockaddr_in *psStack_40;
  
  psStack_40 = (sockaddr_in *)0x17e134;
  pcVar2 = (code *)uv_default_loop();
  puVar9 = (uv_tcp_t *)0x1a4e5a;
  iVar5 = 0x23a3;
  psStack_40 = (sockaddr_in *)0x17e14f;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    iVar5 = 0x333920;
    psStack_40 = (sockaddr_in *)0x17e166;
    puVar9 = (uv_tcp_t *)pcVar2;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_0017e295;
    puVar9 = &tcp_server;
    iVar5 = 0x333910;
    psStack_40 = (sockaddr_in *)0x17e183;
    iVar1 = uv_tcp_bind(&tcp_server,&addr,0);
    if (iVar1 != 0) goto LAB_0017e29a;
    puVar9 = &tcp_server;
    iVar5 = 2;
    psStack_40 = (sockaddr_in *)0x17e1a3;
    iVar1 = uv_listen(&tcp_server,2,connection_cb);
    if (iVar1 != 0) goto LAB_0017e29f;
    unaff_R14 = tcp_outgoing;
    unaff_R13 = 0;
    unaff_R15 = &addr;
    unaff_R12 = connect_cb;
    do {
      psStack_40 = (sockaddr_in *)0x17e1d5;
      puVar6 = unaff_R14;
      puVar9 = (uv_tcp_t *)pcVar2;
      iVar1 = uv_tcp_init();
      iVar5 = (int)puVar6;
      if (iVar1 != 0) {
LAB_0017e28b:
        psStack_40 = (sockaddr_in *)0x17e290;
        run_test_tcp_close_accept_cold_5();
        goto LAB_0017e290;
      }
      puVar9 = (uv_tcp_t *)((long)connect_reqs[0].reserved + unaff_R13 + -0x10);
      psStack_40 = (sockaddr_in *)0x17e1f1;
      puVar6 = unaff_R14;
      iVar1 = uv_tcp_connect(puVar9,unaff_R14,&addr,connect_cb);
      iVar5 = (int)puVar6;
      if (iVar1 != 0) {
        psStack_40 = (sockaddr_in *)0x17e28b;
        run_test_tcp_close_accept_cold_6();
        goto LAB_0017e28b;
      }
      unaff_R14 = unaff_R14 + 1;
      unaff_R13 = unaff_R13 + 0x60;
    } while (unaff_R13 == 0x60);
    iVar5 = 0;
    psStack_40 = (sockaddr_in *)0x17e214;
    puVar9 = (uv_tcp_t *)pcVar2;
    uv_run();
    if (got_connections != 2) goto LAB_0017e2a4;
    if (close_cb_called != 4) goto LAB_0017e2a9;
    if (write_cb_called != 2) goto LAB_0017e2ae;
    if (read_cb_called != 1) goto LAB_0017e2b3;
    psStack_40 = (sockaddr_in *)0x17e241;
    pcVar2 = (code *)uv_default_loop();
    psStack_40 = (sockaddr_in *)0x17e255;
    uv_walk(pcVar2,close_walk_cb,0);
    iVar5 = 0;
    psStack_40 = (sockaddr_in *)0x17e25f;
    uv_run(pcVar2);
    psStack_40 = (sockaddr_in *)0x17e264;
    puVar9 = (uv_tcp_t *)uv_default_loop();
    psStack_40 = (sockaddr_in *)0x17e26c;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      psStack_40 = (sockaddr_in *)0x17e275;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_0017e290:
    psStack_40 = (sockaddr_in *)0x17e295;
    run_test_tcp_close_accept_cold_1();
LAB_0017e295:
    psStack_40 = (sockaddr_in *)0x17e29a;
    run_test_tcp_close_accept_cold_2();
LAB_0017e29a:
    psStack_40 = (sockaddr_in *)0x17e29f;
    run_test_tcp_close_accept_cold_3();
LAB_0017e29f:
    psStack_40 = (sockaddr_in *)0x17e2a4;
    run_test_tcp_close_accept_cold_4();
LAB_0017e2a4:
    psStack_40 = (sockaddr_in *)0x17e2a9;
    run_test_tcp_close_accept_cold_7();
LAB_0017e2a9:
    psStack_40 = (sockaddr_in *)0x17e2ae;
    run_test_tcp_close_accept_cold_8();
LAB_0017e2ae:
    psStack_40 = (sockaddr_in *)0x17e2b3;
    run_test_tcp_close_accept_cold_9();
LAB_0017e2b3:
    psStack_40 = (sockaddr_in *)0x17e2b8;
    run_test_tcp_close_accept_cold_10();
  }
  psStack_40 = (sockaddr_in *)connection_cb;
  run_test_tcp_close_accept_cold_11();
  puStack_60 = (uv_loop_t *)pcVar2;
  pcStack_58 = unaff_R12;
  lStack_50 = unaff_R13;
  puStack_48 = unaff_R14;
  psStack_40 = unaff_R15;
  if (puVar9 == &tcp_server) {
    uVar3 = (ulong)got_connections;
    if (uVar3 == 2) {
      return got_connections;
    }
    got_connections = got_connections + 1;
    puVar8 = (uv_loop_t *)(tcp_incoming + uVar3);
    puStack_68 = (uv_loop_t *)0x17e30b;
    puVar7 = puVar8;
    puVar9 = (uv_tcp_t *)tcp_server.loop;
    iVar1 = uv_tcp_init();
    iVar5 = (int)puVar7;
    pcVar2 = (code *)puVar8;
    if (iVar1 != 0) goto LAB_0017e371;
    puVar9 = &tcp_server;
    puStack_68 = (uv_loop_t *)0x17e31e;
    iVar1 = uv_accept();
    iVar5 = (int)puVar8;
    if (iVar1 == 0) {
      if (got_connections != 2) {
        return 0;
      }
      lVar10 = 0;
      pcVar2 = alloc_cb;
      while( true ) {
        puVar9 = (uv_tcp_t *)((long)tcp_incoming[0].handle_queue + lVar10 + -0x20);
        iVar5 = 0x17e478;
        puStack_68 = (uv_loop_t *)0x17e351;
        iVar1 = uv_read_start(puVar9,alloc_cb,read_cb);
        if (iVar1 != 0) break;
        lVar10 = lVar10 + 0xf8;
        if (lVar10 != 0xf8) {
          return 0;
        }
      }
      puStack_68 = (uv_loop_t *)0x17e36c;
      connection_cb_cold_4();
      goto LAB_0017e36c;
    }
  }
  else {
LAB_0017e36c:
    puStack_68 = (uv_loop_t *)0x17e371;
    connection_cb_cold_1();
LAB_0017e371:
    puStack_68 = (uv_loop_t *)0x17e376;
    connection_cb_cold_2();
  }
  puStack_68 = (uv_loop_t *)connect_cb;
  connection_cb_cold_3();
  puStack_68 = (uv_loop_t *)pcVar2;
  if (puVar9 == (uv_tcp_t *)&tcp_check_req) {
    if (iVar5 != 0) {
      uv_close(tcp_incoming + pending_incoming,close_cb);
      iVar1 = uv_close(&tcp_check,close_cb);
      return iVar1;
    }
    goto LAB_0017e473;
  }
  if (iVar5 == 0) {
    if (puVar9 < connect_reqs) goto LAB_0017e464;
    if (&got_connections < puVar9) goto LAB_0017e469;
    uVar4 = (int)((ulong)((uv_loop_t *)((long)puVar9 + -0x333d80))->process_handles >> 5) *
            -0x55555555;
    auStack_78 = uv_buf_init("x",1);
    iVar1 = uv_write(write_reqs + uVar4,tcp_outgoing + uVar4,auStack_78,1,write_cb);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    connect_cb_cold_1();
LAB_0017e464:
    connect_cb_cold_4();
LAB_0017e469:
    connect_cb_cold_3();
  }
  connect_cb_cold_2();
LAB_0017e473:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 1;
  return 0x333ed0;
}

Assistant:

TEST_IMPL(tcp_close_accept) {
  unsigned int i;
  uv_loop_t* loop;
  uv_tcp_t* client;

  /*
   * A little explanation of what goes on below:
   *
   * We'll create server and connect to it using two clients, each writing one
   * byte once connected.
   *
   * When all clients will be accepted by server - we'll start reading from them
   * and, on first client's first byte, will close second client and server.
   * After that, we'll immediately initiate new connection to server using
   * tcp_check handle (thus, reusing fd from second client).
   *
   * In this situation uv__io_poll()'s event list should still contain read
   * event for second client, and, if not cleaned up properly, `tcp_check` will
   * receive stale event of second incoming and invoke `connect_cb` with zero
   * status.
   */

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(loop, &tcp_server));
  ASSERT(0 == uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &tcp_server,
                        ARRAY_SIZE(tcp_outgoing),
                        connection_cb));

  for (i = 0; i < ARRAY_SIZE(tcp_outgoing); i++) {
    client = tcp_outgoing + i;

    ASSERT(0 == uv_tcp_init(loop, client));
    ASSERT(0 == uv_tcp_connect(&connect_reqs[i],
                               client,
                               (const struct sockaddr*) &addr,
                               connect_cb));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(tcp_outgoing) == got_connections);
  ASSERT((ARRAY_SIZE(tcp_outgoing) + 2) == close_cb_called);
  ASSERT(ARRAY_SIZE(tcp_outgoing) == write_cb_called);
  ASSERT(1 == read_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}